

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O2

void __thiscall SSD1306::OledI2C::unsetPixel(OledI2C *this,OledPoint p)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  
  bVar3 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar3) {
    uVar2 = (ulong)(uint)(p.m_x >> 0x1f) << 0x20 | (ulong)p & 0xffffffff;
    iVar5 = (int)((long)uVar2 / 0x20) +
            (int)((long)((ulong)(uint)(p.m_y >> 0x1f) << 0x20 | (ulong)p >> 0x20) / 8) * 4;
    lVar4 = (long)(int)((long)uVar2 % 0x20);
    bVar1 = (this->blocks_)._M_elems[iVar5].bytes_._M_elems[lVar4 + 1];
    if ((bVar1 >> (p.m_y & 7U) & 1) != 0) {
      (this->blocks_)._M_elems[iVar5].bytes_._M_elems[lVar4 + 1] =
           ~(byte)(1 << ((byte)p.m_y & 7)) & bVar1;
      if ((this->blocks_)._M_elems[iVar5].dirty_ == false) {
        (this->blocks_)._M_elems[iVar5].dirty_ = true;
      }
    }
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::unsetPixel(
    SSD1306::OledPoint p)
{
    if (not pixelInside(p))
    {
        return;
    }

    PixelOffset po{p};

    if ((blocks_[po.block].bytes_[po.byte] & (1 << po.bit)) != 0)
    {
        blocks_[po.block].bytes_[po.byte] &= ~(1 << po.bit);

        if (not blocks_[po.block].dirty_)
        {
            blocks_[po.block].dirty_ = true;
        }
    }
}